

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O1

uint nsvg__parseColor(char *str)

{
  char cVar1;
  uint in_EAX;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  char *__s;
  long lVar6;
  undefined8 uStack_28;
  
  do {
    __s = str;
    cVar1 = *__s;
    str = __s + 1;
  } while (cVar1 == ' ');
  uStack_28._0_4_ = in_EAX;
  sVar4 = strlen(__s);
  if (cVar1 == '#' && sVar4 != 0) {
    uStack_28 = (ulong)(uint)uStack_28;
    cVar1 = *str;
    lVar6 = 0;
    while ((cVar1 != '\0' && (pvVar5 = memchr(" \t\n\v\f\r",(int)cVar1,7), pvVar5 == (void *)0x0)))
    {
      cVar1 = __s[lVar6 + 2];
      lVar6 = lVar6 + 1;
    }
    if ((int)lVar6 == 3) {
      __isoc99_sscanf(str,"%x",(long)&uStack_28 + 4);
      uVar3 = (uStack_28._4_4_ & 0xf00) << 8 | (uStack_28._4_4_ & 0xf0) << 4 | uStack_28._4_4_ & 0xf
      ;
      uStack_28 = (ulong)(uVar3 << 4 | uVar3) << 0x20;
    }
    else if ((int)lVar6 == 6) {
      __isoc99_sscanf(str,"%x",(long)&uStack_28 + 4);
    }
    uVar3 = (uStack_28._4_4_ & 0xff) << 0x10 |
            uStack_28._4_4_ & 0xff00 | uStack_28._4_4_ >> 0x10 & 0xff;
  }
  else {
    if ((((cVar1 == 'r' && 3 < sVar4) && (*str == 'g')) && (__s[2] == 'b')) && (__s[3] == '(')) {
      uVar3 = nsvg__parseColorRGB(__s);
      return uVar3;
    }
    lVar6 = 8;
    do {
      iVar2 = strcmp(*(char **)(lVar6 + 0x12a388),__s);
      if (iVar2 == 0) {
        return *(uint *)((long)&nsvg__colors[0].name + lVar6);
      }
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0xa8);
    uVar3 = 0x808080;
  }
  return uVar3;
}

Assistant:

static unsigned int nsvg__parseColor(const char* str)
{
	size_t len = 0;
	while(*str == ' ') ++str;
	len = strlen(str);
	if (len >= 1 && *str == '#')
		return nsvg__parseColorHex(str);
	else if (len >= 4 && str[0] == 'r' && str[1] == 'g' && str[2] == 'b' && str[3] == '(')
		return nsvg__parseColorRGB(str);
	return nsvg__parseColorName(str);
}